

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolui.c
# Opt level: O0

int ffu2fi8(unsigned_short *input,long ntodo,double scale,double zero,LONGLONG *output,int *status)

{
  double dVar1;
  double dvalue;
  long ii;
  int *status_local;
  LONGLONG *output_local;
  double zero_local;
  double scale_local;
  long ntodo_local;
  unsigned_short *input_local;
  
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 9.223372036854776e+18)) || (NAN(zero))) {
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
      for (ii = 0; ii < ntodo; ii = ii + 1) {
        dVar1 = ((double)input[ii] - zero) / scale;
        if (-9.223372036854776e+18 <= dVar1) {
          if (dVar1 <= 9.223372036854776e+18) {
            if (dVar1 < 0.0) {
              output[ii] = (long)(dVar1 - 0.5);
            }
            else {
              output[ii] = (long)(dVar1 + 0.5);
            }
          }
          else {
            *status = -0xb;
            output[ii] = 0x7fffffffffffffff;
          }
        }
        else {
          *status = -0xb;
          output[ii] = -0x8000000000000000;
        }
      }
    }
    else {
      for (ii = 0; ii < ntodo; ii = ii + 1) {
        output[ii] = (ulong)input[ii];
      }
    }
  }
  else {
    for (ii = 0; ii < ntodo; ii = ii + 1) {
      output[ii] = (ulong)input[ii] ^ 0x8000000000000000;
    }
  }
  return *status;
}

Assistant:

int ffu2fi8(unsigned short *input,  /* I - array of values to be converted  */
            long ntodo,             /* I - number of elements in the array  */
            double scale,           /* I - FITS TSCALn or BSCALE value      */
            double zero,            /* I - FITS TZEROn or BZERO  value      */
            LONGLONG *output,       /* O - output array of converted values */
            int *status)            /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero ==  9223372036854775808.)
    {       
        /* Writing to unsigned long long column. */
        /* Instead of subtracting 9223372036854775808, it is more efficient */
        /* and more precise to just flip the sign bit with the XOR operator */

        /* no need to check range limits because all unsigned short values */
	/* are valid ULONGLONG values. */

        for (ii = 0; ii < ntodo; ii++) {
             output[ii] =  ((LONGLONG) input[ii]) ^ 0x8000000000000000;
        }
    }
    else if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
                output[ii] = input[ii];
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = (input[ii] - zero) / scale;

            if (dvalue < DLONGLONG_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = LONGLONG_MIN;
            }
            else if (dvalue > DLONGLONG_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = LONGLONG_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    output[ii] = (LONGLONG) (dvalue + .5);
                else
                    output[ii] = (LONGLONG) (dvalue - .5);
            }
        }
    }
    return(*status);
}